

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTcSymBif::add_runtime_symbol(CTcSymBif *this,CVmRuntimeSymbols *symtab)

{
  vm_val_t local_10;
  
  local_10.typ = VM_BIFPTR;
  local_10.val._0_2_ = (this->super_CTcSymBifBase).func_set_id_;
  local_10.val._2_2_ = (this->super_CTcSymBifBase).func_idx_;
  CVmRuntimeSymbols::add_sym
            (symtab,(this->super_CTcSymBifBase).super_CTcSymbol.super_CTcSymbolBase.
                    super_CVmHashEntryCS.super_CVmHashEntry.str_,
             (this->super_CTcSymBifBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
             super_CVmHashEntry.len_,&local_10);
  return;
}

Assistant:

void CTcSymBif::add_runtime_symbol(CVmRuntimeSymbols *symtab)
{
    vm_val_t val;

    /* add an entry for our absolute address */
    val.set_bifptr(func_set_id_, func_idx_);
    symtab->add_sym(get_sym(), get_sym_len(), &val);
}